

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPulley.cpp
# Opt level: O1

void __thiscall chrono::ChLinkPulley::UpdateTime(ChLinkPulley *this,double mytime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined8 uVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  bool bVar15;
  char cVar16;
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  double m12;
  double m02;
  double m10;
  double m01;
  double m20;
  double m21;
  ChCoordsys<double> newmarkpos;
  undefined1 local_268 [16];
  undefined1 local_228 [16];
  undefined1 local_208 [16];
  Coordsys local_1e8;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_190;
  undefined1 local_188 [16];
  double local_170;
  double local_168;
  double local_160;
  Vector local_158;
  double local_140;
  ChFrame<double> local_138;
  ChFrame<double> local_b0;
  undefined1 extraout_var [56];
  
  local_188._8_8_ = local_188._0_8_;
  ChLinkLockLock::UpdateTime(&this->super_ChLinkLockLock,mytime);
  local_138._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_138.coord.pos.m_data[0] = 0.0;
  local_138.coord.pos.m_data[1] = 0.0;
  local_138.coord.pos.m_data[2] = 0.0;
  local_b0._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_b0.coord.pos.m_data[0] = 0.0;
  local_b0.coord.pos.m_data[1] = 0.0;
  local_b0.coord.pos.m_data[2] = 0.0;
  local_b0.coord.rot.m_data[0] = 1.0;
  local_b0.coord.rot.m_data[1] = 0.0;
  local_b0.coord.rot.m_data[2] = 0.0;
  local_b0.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_b0.Amatrix,(ChQuaternion<double> *)&local_138);
  local_1e8.pos.m_data[0] = 1.0;
  local_1e8.pos.m_data[1] = 0.0;
  local_1e8.pos.m_data[2] = 0.0;
  local_1e8.rot.m_data[0] = 0.0;
  local_138._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_138.coord.pos.m_data[0] = 0.0;
  local_138.coord.pos.m_data[1] = 0.0;
  local_138.coord.pos.m_data[2] = 0.0;
  local_138.coord.rot.m_data[0] = 1.0;
  local_138.coord.rot.m_data[1] = 0.0;
  local_138.coord.rot.m_data[2] = 0.0;
  local_138.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_138.Amatrix,(ChQuaternion<double> *)&local_1e8);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)
             (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body1,
             &this->local_shaft1,&local_b0);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)
             (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body2,
             &this->local_shaft2,&local_138);
  Get_shaft_pos2(&local_1e8.pos,this);
  Get_shaft_pos1(&local_158,this);
  dVar28 = local_1e8.pos.m_data[0] - local_158.m_data[0];
  dVar27 = local_1e8.pos.m_data[1] - local_158.m_data[1];
  dVar11 = local_1e8.pos.m_data[2] - local_158.m_data[2];
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar28;
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       dVar27 * local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar25 = vfmadd231sd_fma(auVar66,auVar59,auVar25);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar11;
  auVar25 = vfmadd231sd_fma(auVar25,auVar31,auVar1);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       dVar27 * local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar1 = vfmadd231sd_fma(auVar72,auVar59,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_b0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar1 = vfmadd231sd_fma(auVar1,auVar31,auVar3);
  dVar17 = auVar1._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar17 * dVar17;
  auVar1 = vfmadd231sd_fma(auVar32,auVar25,auVar25);
  if (auVar1._0_8_ < 0.0) {
    dVar18 = sqrt(auVar1._0_8_);
  }
  else {
    auVar1 = vsqrtsd_avx(auVar1,auVar1);
    dVar18 = auVar1._0_8_;
  }
  bVar13 = 2.2250738585072014e-308 <= dVar18;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar28;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       dVar27 * local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
  auVar1 = vfmadd231sd_fma(auVar81,auVar33,auVar4);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar11;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar1 = vfmadd231sd_fma(auVar1,auVar60,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       dVar27 * local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar2 = vfmadd231sd_fma(auVar86,auVar33,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_138.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar2 = vfmadd231sd_fma(auVar2,auVar60,auVar7);
  dVar29 = auVar2._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar29 * dVar29;
  auVar2 = vfmadd231sd_fma(auVar34,auVar1,auVar1);
  if (auVar2._0_8_ < 0.0) {
    dVar30 = sqrt(auVar2._0_8_);
  }
  else {
    auVar2 = vsqrtsd_avx(auVar2,auVar2);
    dVar30 = auVar2._0_8_;
  }
  bVar15 = 2.2250738585072014e-308 <= dVar30;
  dVar26 = ChAtan2((double)((ulong)bVar13 * (long)(auVar25._0_8_ * (1.0 / dVar18)) +
                           (ulong)!bVar13 * 0x3ff0000000000000),
                   (double)((ulong)bVar13 * (long)(dVar17 * (1.0 / dVar18))));
  auVar52._0_8_ =
       ChAtan2((double)((ulong)bVar15 * (long)(auVar1._0_8_ * (1.0 / dVar30)) +
                       (ulong)!bVar15 * 0x3ff0000000000000),
               (double)((ulong)bVar15 * (long)(dVar29 * (1.0 / dVar30))));
  auVar52._8_56_ = extraout_var;
  dVar17 = this->a1;
  dVar18 = this->a2;
  auVar73._0_8_ = dVar17 / 6.283185307179586;
  auVar73._8_8_ = 0;
  auVar25 = vroundsd_avx(auVar73,auVar73,9);
  auVar76._0_8_ = dVar18 / 6.283185307179586;
  auVar76._8_8_ = 0;
  auVar2 = vroundsd_avx(auVar76,auVar76,9);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar26;
  auVar25 = vfmadd213sd_fma(auVar25,ZEXT816(0x401921fb54442d18),auVar8);
  dVar29 = auVar25._0_8_;
  auVar92._8_8_ = 0x7fffffffffffffff;
  auVar92._0_8_ = 0x7fffffffffffffff;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = (dVar29 + 6.283185307179586) - dVar17;
  auVar25 = vandpd_avx(auVar91,auVar92);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar29 - dVar17;
  auVar1 = vandpd_avx(auVar92,auVar53);
  uVar12 = vcmpsd_avx512f(auVar25,auVar1,1);
  bVar13 = (bool)((byte)uVar12 & 1);
  dVar17 = (double)((ulong)bVar13 * (long)(dVar29 + 6.283185307179586) +
                   (ulong)!bVar13 * (long)dVar29);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = (dVar29 + -6.283185307179586) - dVar17;
  auVar25 = vandpd_avx(auVar92,auVar82);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar29 - dVar17;
  auVar1 = vandpd_avx(auVar92,auVar74);
  uVar12 = vcmpsd_avx512f(auVar25,auVar1,1);
  bVar13 = (bool)((byte)uVar12 & 1);
  dVar17 = (double)((ulong)bVar13 * (long)(dVar29 + -6.283185307179586) +
                   (ulong)!bVar13 * (long)dVar17);
  this->a1 = dVar17;
  auVar25 = vfmadd213sd_fma(auVar2,ZEXT816(0x401921fb54442d18),auVar52._0_16_);
  dVar29 = auVar25._0_8_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = (dVar29 + 6.283185307179586) - dVar18;
  auVar25 = vandpd_avx(auVar92,auVar35);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar29 - dVar18;
  auVar1 = vandpd_avx(auVar92,auVar61);
  uVar12 = vcmpsd_avx512f(auVar25,auVar1,1);
  bVar13 = (bool)((byte)uVar12 & 1);
  dVar18 = (double)((ulong)bVar13 * (long)(dVar29 + 6.283185307179586) +
                   (ulong)!bVar13 * (long)dVar29);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = (dVar29 + -6.283185307179586) - dVar18;
  auVar25 = vandpd_avx(auVar92,auVar62);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = dVar29 - dVar18;
  auVar1 = vandpd_avx(auVar92,auVar67);
  uVar12 = vcmpsd_avx512f(auVar25,auVar1,1);
  bVar13 = (bool)((byte)uVar12 & 1);
  dVar18 = (double)((ulong)bVar13 * (long)(dVar29 + -6.283185307179586) +
                   (ulong)!bVar13 * (long)dVar18);
  this->a2 = dVar18;
  local_190 = 0.0;
  if (this->checkphase != false) {
    dVar17 = (dVar17 - this->phase) - dVar18 / this->tau;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = dVar17;
    uVar12 = vcmpsd_avx512f(auVar36,ZEXT816(0x400921fb54442d18),0xe);
    bVar13 = (bool)((byte)uVar12 & 1);
    auVar19._0_8_ =
         (ulong)bVar13 * (long)(dVar17 + -6.283185307179586) + (ulong)!bVar13 * (long)dVar17;
    auVar19._8_8_ = 0;
    auVar25 = vminsd_avx(ZEXT816(0x3fe921fb54442d18),auVar19);
    auVar25 = vmaxsd_avx(ZEXT816(0xbfe921fb54442d18),auVar25);
    local_190 = auVar25._0_8_;
  }
  Get_shaft_dir1(&local_1e8.pos,this);
  Get_shaft_dir1(&local_158,this);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar28;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_158.m_data[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar27 * local_158.m_data[1];
  auVar25 = vfmadd231sd_fma(auVar37,auVar68,auVar9);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = dVar11;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_158.m_data[2];
  auVar25 = vfmadd231sd_fma(auVar25,auVar77,auVar10);
  dVar17 = auVar25._0_8_;
  local_188._0_8_ = dVar28 - dVar17 * local_1e8.pos.m_data[0];
  local_1a8 = dVar27 - dVar17 * local_1e8.pos.m_data[1];
  dVar11 = dVar11 - dVar17 * local_1e8.pos.m_data[2];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_1a8 * local_1a8;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_188._0_8_;
  auVar25 = vfmadd231sd_fma(auVar78,auVar83,auVar83);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar11;
  auVar79 = vfmadd231sd_fma(auVar25,auVar75,auVar75);
  if (auVar79._0_8_ < 0.0) {
    dVar27 = sqrt(auVar79._0_8_);
    auVar79._8_8_ = 0;
    dVar28 = (double)local_188._0_8_;
  }
  else {
    auVar25 = vsqrtsd_avx(auVar79,auVar79);
    dVar27 = auVar25._0_8_;
    dVar28 = (double)local_188._0_8_;
  }
  bVar13 = 2.2250738585072014e-308 <= dVar27;
  dVar27 = 1.0 / dVar27;
  local_228._0_8_ = (ulong)bVar13 * (long)(local_1a8 * dVar27);
  local_228._8_8_ = 0;
  local_268._0_8_ = (ulong)bVar13 * (long)(dVar28 * dVar27) + (ulong)!bVar13 * 0x3ff0000000000000;
  local_268._8_8_ = 0;
  local_208._0_8_ = (ulong)bVar13 * (long)(dVar11 * dVar27);
  local_208._8_8_ = 0;
  if (auVar79._0_8_ < 0.0) {
    dVar28 = sqrt(auVar79._0_8_);
  }
  else {
    auVar25 = vsqrtsd_avx(auVar79,auVar79);
    dVar28 = auVar25._0_8_;
  }
  this->shaft_dist = dVar28;
  Get_shaft_dir1(&local_1e8.pos,this);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_1e8.pos.m_data[0];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_1e8.pos.m_data[1];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_1e8.pos.m_data[2];
  auVar69._8_8_ = 0;
  auVar69._0_8_ = (double)local_228._0_8_ * local_1e8.pos.m_data[2];
  auVar25 = vfmsub231sd_fma(auVar69,auVar54,local_208);
  local_160 = auVar25._0_8_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = (double)local_208._0_8_ * local_1e8.pos.m_data[0];
  auVar25 = vfmsub231sd_fma(auVar70,local_268,auVar63);
  local_168 = auVar25._0_8_;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = (double)local_268._0_8_ * local_1e8.pos.m_data[1];
  auVar25 = vfmsub231sd_fma(auVar55,local_228,auVar38);
  local_170 = auVar25._0_8_;
  dVar28 = acos((this->r1 - this->r2) / this->shaft_dist);
  dVar18 = cos(dVar28);
  dVar29 = sin(dVar28);
  dVar27 = dVar29 * local_160 + dVar18 * (double)local_268._0_8_;
  dVar17 = dVar29 * local_168 + dVar18 * (double)local_228._0_8_;
  dVar18 = dVar29 * local_170 + dVar18 * (double)local_208._0_8_;
  dVar26 = cos(dVar28);
  local_140 = dVar26 * (double)local_268._0_8_;
  dVar28 = sin(dVar28);
  dVar29 = local_140 - dVar28 * local_160;
  dVar30 = dVar26 * (double)local_228._0_8_ - dVar28 * local_168;
  dVar26 = dVar26 * (double)local_208._0_8_ - dVar28 * local_170;
  Get_shaft_pos1(&local_1e8.pos,this);
  dVar28 = this->r1;
  (this->belt_up1).m_data[0] = dVar28 * dVar27 + local_1e8.pos.m_data[0];
  (this->belt_up1).m_data[1] = dVar28 * dVar17 + local_1e8.pos.m_data[1];
  (this->belt_up1).m_data[2] = dVar28 * dVar18 + local_1e8.pos.m_data[2];
  Get_shaft_pos1(&local_1e8.pos,this);
  dVar28 = this->r1;
  (this->belt_low1).m_data[0] = dVar28 * dVar29 + local_1e8.pos.m_data[0];
  (this->belt_low1).m_data[1] = dVar28 * dVar30 + local_1e8.pos.m_data[1];
  (this->belt_low1).m_data[2] = dVar28 * dVar26 + local_1e8.pos.m_data[2];
  Get_shaft_pos1(&local_1e8.pos,this);
  dVar28 = this->r2;
  (this->belt_up2).m_data[0] = dVar28 * dVar27 + (double)local_188._0_8_ + local_1e8.pos.m_data[0];
  (this->belt_up2).m_data[1] = dVar28 * dVar17 + local_1a8 + local_1e8.pos.m_data[1];
  (this->belt_up2).m_data[2] = dVar11 + local_1e8.pos.m_data[2] + dVar28 * dVar18;
  Get_shaft_pos1(&local_1e8.pos,this);
  dVar28 = this->r2;
  (this->belt_low2).m_data[0] = dVar28 * dVar29 + (double)local_188._0_8_ + local_1e8.pos.m_data[0];
  (this->belt_low2).m_data[1] = dVar28 * dVar30 + local_1a8 + local_1e8.pos.m_data[1];
  (this->belt_low2).m_data[2] = dVar11 + local_1e8.pos.m_data[2] + dVar28 * dVar26;
  dVar28 = (this->belt_up2).m_data[0] - (this->belt_up1).m_data[0];
  dVar11 = (this->belt_up2).m_data[1] - (this->belt_up1).m_data[1];
  dVar29 = (this->belt_up2).m_data[2] - (this->belt_up1).m_data[2];
  auVar39._8_8_ = 0;
  auVar39._0_8_ = dVar11 * dVar11;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = dVar28;
  auVar25 = vfmadd231sd_fma(auVar39,auVar64,auVar64);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar29;
  auVar25 = vfmadd231sd_fma(auVar25,auVar84,auVar84);
  if (auVar25._0_8_ < 0.0) {
    dVar30 = sqrt(auVar25._0_8_);
  }
  else {
    auVar25 = vsqrtsd_avx(auVar25,auVar25);
    dVar30 = auVar25._0_8_;
  }
  bVar13 = 2.2250738585072014e-308 <= dVar30;
  dVar30 = 1.0 / dVar30;
  dVar11 = (double)((ulong)bVar13 * (long)(dVar11 * dVar30));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar11;
  auVar21._0_8_ =
       (double)((ulong)bVar13 * (long)(dVar28 * dVar30) + (ulong)!bVar13 * 0x3ff0000000000000);
  auVar21._8_8_ = 0;
  dVar28 = (double)((ulong)bVar13 * (long)(dVar29 * dVar30));
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar28;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = dVar17;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar18;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = dVar17 * dVar28;
  auVar1 = vfmsub231sd_fma(auVar85,auVar20,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar27;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar18 * auVar21._0_8_;
  auVar25 = vfmsub231sd_fma(auVar87,auVar57,auVar22);
  dVar17 = auVar25._0_8_;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = dVar27 * dVar11;
  auVar2 = vfmsub231sd_fma(auVar89,auVar71,auVar21);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = dVar17 * dVar17;
  auVar25 = vfmadd231sd_fma(auVar40,auVar1,auVar1);
  auVar25 = vfmadd231sd_fma(auVar25,auVar2,auVar2);
  if (auVar25._0_8_ < 0.0) {
    dVar27 = sqrt(auVar25._0_8_);
  }
  else {
    auVar25 = vsqrtsd_avx(auVar25,auVar25);
    dVar27 = auVar25._0_8_;
  }
  bVar13 = 2.2250738585072014e-308 <= dVar27;
  dVar27 = 1.0 / dVar27;
  dVar17 = (double)((ulong)bVar13 * (long)(dVar27 * dVar17));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar17;
  auVar24._0_8_ =
       (double)((ulong)bVar13 * (long)(dVar27 * auVar1._0_8_) + (ulong)!bVar13 * 0x3ff0000000000000)
  ;
  auVar24._8_8_ = 0;
  dVar27 = (double)((ulong)bVar13 * (long)(auVar2._0_8_ * dVar27));
  local_188._8_8_ = 0;
  local_188._0_8_ = dVar27;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dVar11 * dVar27;
  auVar1 = vfmsub231sd_fma(auVar80,auVar23,auVar22);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dVar28 * auVar24._0_8_;
  auVar25 = vfmsub231sd_fma(auVar88,local_188,auVar21);
  dVar18 = auVar25._0_8_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = auVar21._0_8_ * dVar17;
  auVar2 = vfmsub231sd_fma(auVar90,auVar24,auVar20);
  local_1a8 = auVar2._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar18 * dVar18;
  auVar25 = vfmadd231sd_fma(auVar41,auVar1,auVar1);
  auVar25 = vfmadd231sd_fma(auVar25,auVar2,auVar2);
  if (auVar25._0_8_ < 0.0) {
    dVar29 = sqrt(auVar25._0_8_);
    dVar27 = (double)local_188._0_8_;
  }
  else {
    auVar25 = vsqrtsd_avx(auVar25,auVar25);
    dVar29 = auVar25._0_8_;
  }
  bVar13 = 2.2250738585072014e-308 <= dVar29;
  dVar29 = 1.0 / dVar29;
  dVar30 = local_1a8 * dVar29;
  local_1a8 = (double)((ulong)bVar13 * (long)(dVar29 * dVar18));
  dVar18 = (double)((ulong)bVar13 * (long)(dVar29 * auVar1._0_8_) +
                   (ulong)!bVar13 * 0x3ff0000000000000);
  dVar30 = (double)((ulong)bVar13 * (long)dVar30);
  ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2)->motion_type =
       M_MOTION_EXTERNAL;
  ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1)->motion_type =
       M_MOTION_EXTERNAL;
  local_1e8.pos.m_data[2] = 0.0;
  local_1e8.pos.m_data[0] = 0.0;
  local_1e8.pos.m_data[1] = 0.0;
  local_1e8.rot.m_data[0] = 1.0;
  local_1e8.rot.m_data[1] = 0.0;
  local_1e8.rot.m_data[2] = 0.0;
  local_1e8.rot.m_data[3] = 0.0;
  if ((Coordsys *)&this->belt_up1 != &local_1e8) {
    local_1e8.pos.m_data[0] = (this->belt_up1).m_data[0];
    local_1e8.pos.m_data[1] = (this->belt_up1).m_data[1];
    local_1e8.pos.m_data[2] = (this->belt_up1).m_data[2];
  }
  dVar29 = dVar27 + auVar21._0_8_ + local_1a8;
  uStack_1a0 = 0;
  if (0.0 <= dVar29) {
    dVar27 = dVar29 + 1.0;
    if (dVar27 < 0.0) {
      local_1e8.rot.m_data[3] = sqrt(dVar27);
    }
    else {
      auVar42._8_8_ = 0;
      auVar42._0_8_ = dVar27;
      auVar25 = vsqrtsd_avx(auVar42,auVar42);
      local_1e8.rot.m_data[3] = auVar25._0_8_;
    }
    local_1e8.rot.m_data[0] = local_1e8.rot.m_data[3] * 0.5;
    local_1e8.rot.m_data[3] = 0.5 / local_1e8.rot.m_data[3];
    local_1e8.rot.m_data[1] = (dVar30 - dVar17) * local_1e8.rot.m_data[3];
    local_1e8.rot.m_data[2] = (auVar24._0_8_ - dVar28) * local_1e8.rot.m_data[3];
    local_1e8.rot.m_data[3] = (dVar11 - dVar18) * local_1e8.rot.m_data[3];
  }
  else {
    cVar16 = auVar21._0_8_ < local_1a8;
    dVar26 = auVar21._0_8_;
    if ((bool)cVar16) {
      dVar26 = local_1a8;
    }
    if (dVar26 < dVar27) {
      cVar16 = '\x02';
    }
    if (cVar16 == '\x02') {
      dVar27 = ((dVar27 - auVar21._0_8_) - local_1a8) + 1.0;
      if (dVar27 < 0.0) {
        dVar27 = sqrt(dVar27);
      }
      else {
        auVar44._8_8_ = 0;
        auVar44._0_8_ = dVar27;
        auVar25 = vsqrtsd_avx(auVar44,auVar44);
        dVar27 = auVar25._0_8_;
      }
      local_1e8.rot.m_data[3] = dVar27 * 0.5;
      dVar27 = 0.5 / dVar27;
      local_1e8.rot.m_data[1] = (auVar24._0_8_ + dVar28) * dVar27;
      local_1e8.rot.m_data[2] = (dVar30 + dVar17) * dVar27;
      local_1e8.rot.m_data[0] = dVar11 - dVar18;
    }
    else if (cVar16 == '\x01') {
      dVar27 = ((local_1a8 - dVar27) - auVar21._0_8_) + 1.0;
      if (dVar27 < 0.0) {
        dVar27 = sqrt(dVar27);
      }
      else {
        auVar43._8_8_ = 0;
        auVar43._0_8_ = dVar27;
        auVar25 = vsqrtsd_avx(auVar43,auVar43);
        dVar27 = auVar25._0_8_;
      }
      local_1e8.rot.m_data[2] = dVar27 * 0.5;
      dVar27 = 0.5 / dVar27;
      local_1e8.rot.m_data[3] = (dVar30 + dVar17) * dVar27;
      local_1e8.rot.m_data[1] = (dVar11 + dVar18) * dVar27;
      local_1e8.rot.m_data[0] = auVar24._0_8_ - dVar28;
    }
    else {
      dVar27 = ((auVar21._0_8_ - local_1a8) - dVar27) + 1.0;
      if (dVar27 < 0.0) {
        dVar27 = sqrt(dVar27);
      }
      else {
        auVar45._8_8_ = 0;
        auVar45._0_8_ = dVar27;
        auVar25 = vsqrtsd_avx(auVar45,auVar45);
        dVar27 = auVar25._0_8_;
      }
      local_1e8.rot.m_data[1] = dVar27 * 0.5;
      dVar27 = 0.5 / dVar27;
      local_1e8.rot.m_data[2] = (dVar11 + dVar18) * dVar27;
      local_1e8.rot.m_data[3] = (auVar24._0_8_ + dVar28) * dVar27;
      local_1e8.rot.m_data[0] = dVar30 - dVar17;
    }
    local_1e8.rot.m_data[0] = local_1e8.rot.m_data[0] * dVar27;
  }
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1,&local_1e8);
  if ((Coordsys *)&this->belt_up2 != &local_1e8) {
    local_1e8.pos.m_data[0] = (this->belt_up2).m_data[0];
    local_1e8.pos.m_data[1] = (this->belt_up2).m_data[1];
    local_1e8.pos.m_data[2] = (this->belt_up2).m_data[2];
  }
  if (0.0 <= dVar29) {
    dVar29 = dVar29 + 1.0;
    if (dVar29 < 0.0) {
      local_1e8.rot.m_data[3] = sqrt(dVar29);
    }
    else {
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar29;
      auVar25 = vsqrtsd_avx(auVar46,auVar46);
      local_1e8.rot.m_data[3] = auVar25._0_8_;
    }
    local_1e8.rot.m_data[0] = local_1e8.rot.m_data[3] * 0.5;
    local_1e8.rot.m_data[3] = 0.5 / local_1e8.rot.m_data[3];
    local_1e8.rot.m_data[1] = (dVar30 - dVar17) * local_1e8.rot.m_data[3];
    local_1e8.rot.m_data[2] = (auVar24._0_8_ - dVar28) * local_1e8.rot.m_data[3];
    local_1e8.rot.m_data[3] = (dVar11 - dVar18) * local_1e8.rot.m_data[3];
  }
  else {
    cVar16 = auVar21._0_8_ < local_1a8;
    dVar27 = auVar21._0_8_;
    if ((bool)cVar16) {
      dVar27 = local_1a8;
    }
    if (dVar27 < (double)local_188._0_8_) {
      cVar16 = '\x02';
    }
    if (cVar16 == '\x02') {
      dVar27 = (((double)local_188._0_8_ - auVar21._0_8_) - local_1a8) + 1.0;
      if (dVar27 < 0.0) {
        local_1e8.rot.m_data[0] = sqrt(dVar27);
      }
      else {
        auVar48._8_8_ = 0;
        auVar48._0_8_ = dVar27;
        auVar25 = vsqrtsd_avx(auVar48,auVar48);
        local_1e8.rot.m_data[0] = auVar25._0_8_;
      }
      local_1e8.rot.m_data[3] = local_1e8.rot.m_data[0] * 0.5;
      local_1e8.rot.m_data[0] = 0.5 / local_1e8.rot.m_data[0];
      local_1e8.rot.m_data[1] = (auVar24._0_8_ + dVar28) * local_1e8.rot.m_data[0];
      local_1e8.rot.m_data[2] = (dVar30 + dVar17) * local_1e8.rot.m_data[0];
      dVar28 = dVar11 - dVar18;
    }
    else if (cVar16 == '\x01') {
      dVar27 = ((local_1a8 - (double)local_188._0_8_) - auVar21._0_8_) + 1.0;
      if (dVar27 < 0.0) {
        local_1e8.rot.m_data[0] = sqrt(dVar27);
      }
      else {
        auVar47._8_8_ = 0;
        auVar47._0_8_ = dVar27;
        auVar25 = vsqrtsd_avx(auVar47,auVar47);
        local_1e8.rot.m_data[0] = auVar25._0_8_;
      }
      local_1e8.rot.m_data[2] = local_1e8.rot.m_data[0] * 0.5;
      local_1e8.rot.m_data[0] = 0.5 / local_1e8.rot.m_data[0];
      local_1e8.rot.m_data[3] = (dVar30 + dVar17) * local_1e8.rot.m_data[0];
      local_1e8.rot.m_data[1] = (dVar11 + dVar18) * local_1e8.rot.m_data[0];
      dVar28 = auVar24._0_8_ - dVar28;
    }
    else {
      dVar27 = ((auVar21._0_8_ - local_1a8) - (double)local_188._0_8_) + 1.0;
      if (dVar27 < 0.0) {
        local_1e8.rot.m_data[0] = sqrt(dVar27);
      }
      else {
        auVar49._8_8_ = 0;
        auVar49._0_8_ = dVar27;
        auVar25 = vsqrtsd_avx(auVar49,auVar49);
        local_1e8.rot.m_data[0] = auVar25._0_8_;
      }
      local_1e8.rot.m_data[1] = local_1e8.rot.m_data[0] * 0.5;
      local_1e8.rot.m_data[0] = 0.5 / local_1e8.rot.m_data[0];
      local_1e8.rot.m_data[2] = (dVar11 + dVar18) * local_1e8.rot.m_data[0];
      local_1e8.rot.m_data[3] = (auVar24._0_8_ + dVar28) * local_1e8.rot.m_data[0];
      dVar28 = dVar30 - dVar17;
    }
    local_1e8.rot.m_data[0] = dVar28 * local_1e8.rot.m_data[0];
  }
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,&local_1e8);
  dVar28 = this->r1;
  dVar27 = (this->belt_up2).m_data[1] - (this->belt_up1).m_data[1];
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar27 * dVar27;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = (this->belt_up2).m_data[0] - (this->belt_up1).m_data[0];
  auVar25 = vfmadd231sd_fma(auVar50,auVar58,auVar58);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = (this->belt_up2).m_data[2] - (this->belt_up1).m_data[2];
  auVar25 = vfmadd231sd_fma(auVar25,auVar65,auVar65);
  if (auVar25._0_8_ < 0.0) {
    dVar27 = sqrt(auVar25._0_8_);
  }
  else {
    auVar25 = vsqrtsd_avx(auVar25,auVar25);
    dVar27 = auVar25._0_8_;
  }
  auVar14._8_8_ = 0x8000000000000000;
  auVar14._0_8_ = 0x8000000000000000;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_190 * dVar28 + dVar27;
  auVar25 = vxorpd_avx512vl(auVar51,auVar14);
  dVar28 = (double)vmovlpd_avx(auVar25);
  (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = dVar28;
  (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = 0.0;
  (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = 0.0;
  if (this != (ChLinkPulley *)(sBulletDNAstr64 + 0x2818)) {
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = DAT_00b90ac8;
  }
  if (this != (ChLinkPulley *)(sBulletDNAstr64 + 0x27e0)) {
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] = DAT_00b90ac0;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] = DAT_00b90ac8;
  }
  if (this != (ChLinkPulley *)(sBulletDNAstr64 + 0x26f0)) {
    (this->super_ChLinkLockLock).deltaC.rot.m_data[0] = QUNIT;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[1] = DAT_00b90978;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[2] = DAT_00b90980;
    (this->super_ChLinkLockLock).deltaC.rot.m_data[3] = DAT_00b90988;
  }
  if (this != (ChLinkPulley *)(sBulletDNAstr64 + 0x2698)) {
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[1] = DAT_00b90958;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[2] = DAT_00b90960;
    (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[3] = DAT_00b90968;
  }
  if (this != (ChLinkPulley *)(sBulletDNAstr64 + 0x2660)) {
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[0] = QNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[1] = DAT_00b90958;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[2] = DAT_00b90960;
    (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[3] = DAT_00b90968;
  }
  return;
}

Assistant:

void ChLinkPulley::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkLockLock::UpdateTime(mytime);

    ChFrame<double> abs_shaft1;
    ChFrame<double> abs_shaft2;

    ((ChFrame<double>*)Body1)->TransformLocalToParent(local_shaft1, abs_shaft1);
    ((ChFrame<double>*)Body2)->TransformLocalToParent(local_shaft2, abs_shaft2);

    ChVector<> dcc_w = Vsub(Get_shaft_pos2(), Get_shaft_pos1());

    // compute actual rotation of the two wheels (relative to truss).
    Vector md1 = abs_shaft1.GetA().transpose() * dcc_w;
    md1.z() = 0;
    md1 = Vnorm(md1);
    Vector md2 = abs_shaft2.GetA().transpose() * dcc_w;
    md2.z() = 0;
    md2 = Vnorm(md2);

    double periodic_a1 = ChAtan2(md1.x(), md1.y());
    double periodic_a2 = ChAtan2(md2.x(), md2.y());
    double old_a1 = a1;
    double old_a2 = a2;
    double turns_a1 = floor(old_a1 / CH_C_2PI);
    double turns_a2 = floor(old_a2 / CH_C_2PI);
    double a1U = turns_a1 * CH_C_2PI + periodic_a1 + CH_C_2PI;
    double a1M = turns_a1 * CH_C_2PI + periodic_a1;
    double a1L = turns_a1 * CH_C_2PI + periodic_a1 - CH_C_2PI;
    a1 = a1M;
    if (fabs(a1U - old_a1) < fabs(a1M - old_a1))
        a1 = a1U;
    if (fabs(a1L - a1) < fabs(a1M - a1))
        a1 = a1L;
    double a2U = turns_a2 * CH_C_2PI + periodic_a2 + CH_C_2PI;
    double a2M = turns_a2 * CH_C_2PI + periodic_a2;
    double a2L = turns_a2 * CH_C_2PI + periodic_a2 - CH_C_2PI;
    a2 = a2M;
    if (fabs(a2U - old_a2) < fabs(a2M - old_a2))
        a2 = a2U;
    if (fabs(a2L - a2) < fabs(a2M - a2))
        a2 = a2L;

    // correct marker positions if phasing is not correct
    double m_delta = 0;
    if (checkphase) {
        double realtau = tau;

        m_delta = a1 - phase - (a2 / realtau);

        if (m_delta > CH_C_PI)
            m_delta -= (CH_C_2PI);  // range -180..+180 is better than 0...360
        if (m_delta > (CH_C_PI / 4.0))
            m_delta = (CH_C_PI / 4.0);  // phase correction only in +/- 45�
        if (m_delta < -(CH_C_PI / 4.0))
            m_delta = -(CH_C_PI / 4.0);
        //***TODO***
    }

    // Move markers 1 and 2 to align them as pulley ends

    ChVector<> d21_w = dcc_w - Get_shaft_dir1() * Vdot(Get_shaft_dir1(), dcc_w);
    ChVector<> D21_w = Vnorm(d21_w);

    shaft_dist = d21_w.Length();

    ChVector<> U1_w = Vcross(Get_shaft_dir1(), D21_w);

    double gamma1 = acos((r1 - r2) / shaft_dist);

    ChVector<> Ru_w = D21_w * cos(gamma1) + U1_w * sin(gamma1);
    ChVector<> Rl_w = D21_w * cos(gamma1) - U1_w * sin(gamma1);

    belt_up1 = Get_shaft_pos1() + Ru_w * r1;
    belt_low1 = Get_shaft_pos1() + Rl_w * r1;
    belt_up2 = Get_shaft_pos1() + d21_w + Ru_w * r2;
    belt_low2 = Get_shaft_pos1() + d21_w + Rl_w * r2;

    // marker alignment
    ChVector<> Dxu = Vnorm(belt_up2 - belt_up1);
    ChVector<> Dyu = Ru_w;
    ChVector<> Dzu = Vnorm(Vcross(Dxu, Dyu));
    Dyu = Vnorm(Vcross(Dzu, Dxu));
    ChMatrix33<> maU(Dxu, Dyu, Dzu);

    // ! Require that the BDF routine of marker won't handle speed and acc.calculus of the moved marker 2!
    marker2->SetMotionType(ChMarker::M_MOTION_EXTERNAL);
    marker1->SetMotionType(ChMarker::M_MOTION_EXTERNAL);

    ChCoordsys<> newmarkpos;

    // move marker1 in proper positions
    newmarkpos.pos = this->belt_up1;
    newmarkpos.rot = maU.Get_A_quaternion();
    marker1->Impose_Abs_Coord(newmarkpos);  // move marker1 into teeth position
    // move marker2 in proper positions
    newmarkpos.pos = this->belt_up2;
    newmarkpos.rot = maU.Get_A_quaternion();
    marker2->Impose_Abs_Coord(newmarkpos);  // move marker2 into teeth position

    double phase_correction_up = m_delta * r1;
    double hU = Vlength(belt_up2 - belt_up1) + phase_correction_up;

    // imposed relative positions/speeds
    deltaC.pos = ChVector<>(-hU, 0, 0);
    deltaC_dt.pos = VNULL;
    deltaC_dtdt.pos = VNULL;

    deltaC.rot = QUNIT;  // no relative rotations imposed!
    deltaC_dt.rot = QNULL;
    deltaC_dtdt.rot = QNULL;
}